

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall ON_Surface::IsSphere(ON_Surface *this,ON_Sphere *sphere,double tolerance)

{
  double dVar1;
  double dVar2;
  ON_3dPoint point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  ON_3dPoint point_02;
  ON_3dPoint point_03;
  ON_3dPoint point_04;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ON_RevSurface *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ON_Plane *pOVar14;
  ON_Arc *pOVar15;
  ON_Sphere *pOVar16;
  ulong uVar17;
  uint uVar18;
  byte bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double local_330;
  double local_328;
  ON_3dPoint local_320;
  ON_3dPoint P;
  ON_3dPoint S;
  uint local_2c8;
  ON_Sphere sph1;
  ON_Sphere sph0;
  ON_Arc arc1;
  ON_Arc arc0;
  long *plVar9;
  
  bVar19 = 0;
  bVar3 = ON_IsValid(tolerance);
  dVar20 = tolerance;
  if (!bVar3) {
    dVar20 = 2.3283064365386963e-10;
  }
  dVar20 = (double)((ulong)dVar20 & -(ulong)(0.0 < tolerance));
  dVar23 = (double)(~-(ulong)(0.0 < tolerance) & 0x3df0000000000000 | (ulong)dVar20);
  dVar21 = dVar20;
  this_00 = ON_RevSurface::Cast((ON_Object *)this);
  if (this_00 != (ON_RevSurface *)0x0) {
    bVar3 = ON_RevSurface::IsSpherical(this_00,sphere,dVar23);
    return bVar3;
  }
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  arc0.super_ON_Circle.plane.origin.y = dVar21;
  dVar21 = ON_Interval::Mid((ON_Interval *)&arc0);
  iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar21,0),this,0)
  ;
  plVar9 = (long *)CONCAT44(extraout_var,iVar7);
  if (plVar9 == (long *)0x0) {
    return false;
  }
  pOVar14 = &ON_Plane::World_xy;
  pOVar15 = &arc0;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pOVar15->super_ON_Circle).plane.origin.x = (pOVar14->origin).x;
    pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar19 * -2 + 1) * 8);
    pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
  }
  arc0.super_ON_Circle.radius = 1.0;
  arc0.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  arc0.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  local_2c8 = -(uint)(2.3283064365386963e-10 < dVar23) & SUB84(dVar20,0);
  dVar21 = dVar23;
  cVar4 = (**(code **)(*plVar9 + 0x180))(plVar9,0);
  (**(code **)(*plVar9 + 0x20))(plVar9);
  if (cVar4 != '\0') {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    arc1.super_ON_Circle.plane.origin.y = dVar21;
    dVar21 = ON_Interval::Mid((ON_Interval *)&arc1);
    iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar21,0),this,1);
    plVar9 = (long *)CONCAT44(extraout_var_00,iVar7);
    if (plVar9 != (long *)0x0) {
      pOVar14 = &ON_Plane::World_xy;
      pOVar15 = &arc1;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pOVar15->super_ON_Circle).plane.origin.x = (pOVar14->origin).x;
        pOVar14 = (ON_Plane *)((long)pOVar14 + ((ulong)bVar19 * -2 + 1) * 8);
        pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
      }
      arc1.super_ON_Circle.radius = 1.0;
      arc1.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
      arc1.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
      cVar4 = (**(code **)(*plVar9 + 0x180))(local_2c8,plVar9,0);
      (**(code **)(*plVar9 + 0x20))(plVar9);
      if (cVar4 == '\0') {
        bVar3 = false;
      }
      else {
        ON_Sphere::ON_Sphere(&sph0);
        pOVar15 = &arc0;
        pOVar16 = &sph0;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pOVar16->plane).origin.x = (pOVar15->super_ON_Circle).plane.origin.x;
          pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
          pOVar16 = (ON_Sphere *)((long)pOVar16 + (ulong)bVar19 * -0x10 + 8);
        }
        sph0.radius = arc0.super_ON_Circle.radius;
        bVar5 = ON_Sphere::IsValid(&sph0);
        ON_Sphere::ON_Sphere(&sph1);
        pOVar15 = &arc1;
        pOVar16 = &sph1;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pOVar16->plane).origin.x = (pOVar15->super_ON_Circle).plane.origin.x;
          pOVar15 = (ON_Arc *)((long)pOVar15 + (ulong)bVar19 * -0x10 + 8);
          pOVar16 = (ON_Sphere *)((long)pOVar16 + (ulong)bVar19 * -0x10 + 8);
        }
        sph1.radius = arc1.super_ON_Circle.radius;
        bVar6 = ON_Sphere::IsValid(&sph1);
        if (bVar5 || bVar6) {
          dVar21 = (arc0.super_ON_Circle.radius + arc1.super_ON_Circle.radius) * 7.450580596925e-09;
          local_328 = 0.0;
          local_330 = 0.0;
          for (dVar22 = 0.0; dVar22 < 1.0; dVar22 = dVar22 + 0.25) {
            dVar1 = (dVar22 + dVar22) * 3.141592653589793;
            ON_Circle::PointAt(&local_320,&arc0.super_ON_Circle,dVar1);
            P.z = local_320.z;
            P.x = local_320.x;
            P.y = local_320.y;
            if (bVar5 != false) {
              point.y = local_320.y;
              point.x = local_320.x;
              point.z = local_320.z;
              ON_Sphere::ClosestPointTo(&local_320,&sph0,point);
              S.z = local_320.z;
              S.x = local_320.x;
              S.y = local_320.y;
              dVar2 = ON_3dPoint::DistanceTo(&S,&P);
              if (dVar2 <= dVar21) {
                if (local_328 < dVar2) {
                  local_328 = dVar2;
                }
              }
              else {
                bVar5 = false;
                bVar3 = false;
                if (bVar6 == false) goto LAB_005acf51;
              }
            }
            if (bVar6 != false) {
              point_00.y = P.y;
              point_00.x = P.x;
              point_00.z = P.z;
              ON_Sphere::ClosestPointTo(&local_320,&sph1,point_00);
              S.z = local_320.z;
              S.x = local_320.x;
              S.y = local_320.y;
              dVar2 = ON_3dPoint::DistanceTo(&S,&P);
              if (dVar2 <= dVar21) {
                if (local_330 < dVar2) {
                  local_330 = dVar2;
                }
              }
              else {
                bVar6 = false;
                bVar3 = false;
                if (bVar5 == false) goto LAB_005acf51;
              }
            }
            ON_Circle::PointAt(&local_320,&arc1.super_ON_Circle,dVar1);
            P.z = local_320.z;
            P.x = local_320.x;
            P.y = local_320.y;
            if (bVar5 != false) {
              point_01.y = local_320.y;
              point_01.x = local_320.x;
              point_01.z = local_320.z;
              ON_Sphere::ClosestPointTo(&local_320,&sph0,point_01);
              S.z = local_320.z;
              S.x = local_320.x;
              S.y = local_320.y;
              dVar1 = ON_3dPoint::DistanceTo(&S,&P);
              if (dVar1 <= dVar21) {
                if (local_328 < dVar1) {
                  local_328 = dVar1;
                }
              }
              else {
                bVar5 = false;
                bVar3 = false;
                if (bVar6 == false) goto LAB_005acf51;
              }
            }
            if (bVar6 != false) {
              point_02.y = P.y;
              point_02.x = P.x;
              point_02.z = P.z;
              ON_Sphere::ClosestPointTo(&local_320,&sph1,point_02);
              S.z = local_320.z;
              S.x = local_320.x;
              S.y = local_320.y;
              dVar1 = ON_3dPoint::DistanceTo(&S,&P);
              if (dVar1 <= dVar21) {
                if (local_330 < dVar1) {
                  local_330 = dVar1;
                }
              }
              else {
                bVar6 = false;
                bVar3 = false;
                if (bVar5 == false) goto LAB_005acf51;
              }
            }
          }
          if ((bVar5 == false) && (bVar6 == false)) goto LAB_005acf4f;
          uVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
          iVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
          memblock = onmalloc((long)(int)(uVar8 + iVar7 + 2) << 3);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,memblock);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
          dVar20 = (double)CONCAT44((int)((ulong)dVar23 >> 0x20),SUB84(dVar20,0));
          if (dVar23 <= dVar21) {
            dVar20 = dVar21;
          }
          uVar11 = 0;
          uVar17 = (ulong)uVar8;
          if ((int)uVar8 < 1) {
            uVar17 = uVar11;
          }
          for (; uVar11 != uVar17; uVar11 = uVar11 + 1) {
            for (uVar12 = (uint)(uVar11 != 0); uVar12 != 5; uVar12 = uVar12 + 1) {
              dVar21 = *(double *)((long)memblock + uVar11 * 8 + 8);
              dVar23 = *(double *)((long)memblock + uVar11 * 8);
              for (lVar10 = 0; lVar10 <= iVar7; lVar10 = lVar10 + 1) {
                iVar13 = 4 - (uint)(lVar10 != 0);
                for (uVar18 = (uint)(lVar10 != 0); uVar18 != 5; uVar18 = uVar18 + 1) {
                  PointAt(&local_320,this,
                          ((double)(int)(4 - uVar12) * dVar23 + (double)(int)uVar12 * dVar21) * 0.25
                          ,((double)iVar13 *
                            *(double *)((long)memblock + lVar10 * 8 + (long)(int)uVar8 * 8 + 8) +
                           (double)(int)uVar18 *
                           *(double *)((long)memblock + lVar10 * 8 + (long)(int)uVar8 * 8 + 0x10)) *
                           0.25);
                  P.z = local_320.z;
                  P.x = local_320.x;
                  P.y = local_320.y;
                  if (bVar5 != false) {
                    point_03.y = local_320.y;
                    point_03.x = local_320.x;
                    point_03.z = local_320.z;
                    ON_Sphere::ClosestPointTo(&local_320,&sph0,point_03);
                    S.z = local_320.z;
                    S.x = local_320.x;
                    S.y = local_320.y;
                    dVar22 = ON_3dPoint::DistanceTo(&S,&P);
                    if (dVar22 <= dVar20) {
                      if (local_328 < dVar22) {
                        local_328 = dVar22;
                      }
                      goto LAB_005ace86;
                    }
                    if (bVar6 != false) {
                      bVar5 = false;
                      goto LAB_005ace86;
                    }
LAB_005acf42:
                    onfree(memblock);
                    goto LAB_005acf4f;
                  }
LAB_005ace86:
                  if (bVar6 != false) {
                    point_04.y = P.y;
                    point_04.x = P.x;
                    point_04.z = P.z;
                    ON_Sphere::ClosestPointTo(&local_320,&sph1,point_04);
                    S.z = local_320.z;
                    S.x = local_320.x;
                    S.y = local_320.y;
                    dVar22 = ON_3dPoint::DistanceTo(&S,&P);
                    if (dVar22 <= dVar20) {
                      if (local_330 < dVar22) {
                        local_330 = dVar22;
                      }
                    }
                    else {
                      if (bVar5 == false) goto LAB_005acf42;
                      bVar6 = false;
                    }
                  }
                  iVar13 = iVar13 + -1;
                }
              }
            }
          }
          onfree(memblock);
          bVar3 = (bool)(bVar5 | bVar6);
          if ((sphere != (ON_Sphere *)0x0) && (bVar3 != false)) {
            pOVar16 = &sph0;
            if (local_330 < local_328) {
              pOVar16 = &sph1;
            }
            if (bVar6 == false) {
              pOVar16 = &sph0;
            }
            if (bVar5 == false) {
              pOVar16 = &sph1;
            }
            memcpy(sphere,pOVar16,0x88);
            bVar3 = true;
          }
        }
        else {
LAB_005acf4f:
          bVar3 = false;
        }
LAB_005acf51:
        ON_Sphere::~ON_Sphere(&sph1);
        ON_Sphere::~ON_Sphere(&sph0);
      }
      ON_Plane::~ON_Plane((ON_Plane *)&arc1);
      goto LAB_005acf78;
    }
  }
  bVar3 = false;
LAB_005acf78:
  ON_Plane::~ON_Plane((ON_Plane *)&arc0);
  return bVar3;
}

Assistant:

bool ON_Surface::IsSphere( ON_Sphere* sphere, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsSpherical(sphere,tolerance) ? true : false;
  }

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  // Determine if one of these arcs is a a portion of a 
  // great circle.

  ON_Sphere sph0;
  sph0.plane = arc0.plane;
  sph0.radius = arc0.radius;
  bool bTestSphere0 = sph0.IsValid();

  ON_Sphere sph1;
  sph1.plane = arc1.plane;
  sph1.radius = arc1.radius;
  bool bTestSphere1 = sph1.IsValid();

  if ( !bTestSphere0 && !bTestSphere1 )
    return false;

  double sph0tol = 0.0;
  double sph1tol = 0.0;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_3dPoint P, S;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }
  }
  // If the arc's are both great circles, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestSphere0 && !bTestSphere1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j <= sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestSphere0 )
          {
            S = sph0.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere0 = false;
              if ( !bTestSphere1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph0tol )
              sph0tol = d;
          }
          if ( bTestSphere1 )
          {
            S = sph1.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere1 = false;
              if ( !bTestSphere0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph1tol )
              sph1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestSphere0 || bTestSphere1);
  if ( rc && sphere )
  {
    if (!bTestSphere0)
      *sphere = sph1;
    else if (!bTestSphere1)
      *sphere = sph0;
    else if (sph0tol <= sph1tol)
      *sphere = sph0;
    else
      *sphere = sph1;
  }

  return rc;
}